

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_DCtx_reset(ZSTD_DCtx *dctx,ZSTD_ResetDirective reset)

{
  int in_ESI;
  long in_RDI;
  
  if ((in_ESI == 1) || (in_ESI == 3)) {
    *(undefined4 *)(in_RDI + 0x7618) = 0;
    *(undefined4 *)(in_RDI + 0x766c) = 0;
  }
  if ((in_ESI == 2) || (in_ESI == 3)) {
    if (*(int *)(in_RDI + 0x7618) != 0) {
      return 0xffffffffffffffc4;
    }
    ZSTD_clearDict((ZSTD_DCtx *)0x28b20a);
    ZSTD_DCtx_resetParameters((ZSTD_DCtx *)0x28b214);
  }
  return 0;
}

Assistant:

size_t ZSTD_DCtx_reset(ZSTD_DCtx* dctx, ZSTD_ResetDirective reset)
{
    if ( (reset == ZSTD_reset_session_only)
      || (reset == ZSTD_reset_session_and_parameters) ) {
        dctx->streamStage = zdss_init;
        dctx->noForwardProgress = 0;
    }
    if ( (reset == ZSTD_reset_parameters)
      || (reset == ZSTD_reset_session_and_parameters) ) {
        RETURN_ERROR_IF(dctx->streamStage != zdss_init, stage_wrong, "");
        ZSTD_clearDict(dctx);
        ZSTD_DCtx_resetParameters(dctx);
    }
    return 0;
}